

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O1

void run_ellswift_bench(int iters,int argc,char **argv)

{
  long lVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int in_R9D;
  long lVar5;
  bench_ellswift_data data;
  int in_stack_ffffffffffffbf78;
  undefined8 local_4078 [2057];
  
  local_4078[0] = secp256k1_context_create(1);
  lVar5 = (long)argc;
  if (argc == 1) {
LAB_00102960:
    run_benchmark("ellswift_encode",bench_ellswift_encode,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                  in_stack_ffffffffffffbf78);
  }
  else {
    lVar1 = lVar5 * 8;
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102906;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102960;
LAB_00102906:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102933;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"encode");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102960;
LAB_00102933:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102984;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift_encode");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102960;
  }
LAB_00102984:
  if (argc == 1) {
LAB_00102a1c:
    run_benchmark("ellswift_decode",bench_ellswift_decode,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                  in_stack_ffffffffffffbf78);
  }
  else {
    lVar1 = lVar5 * 8;
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_001029c2;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102a1c;
LAB_001029c2:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_001029ef;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"decode");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102a1c;
LAB_001029ef:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102a40;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift_decode");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102a1c;
  }
LAB_00102a40:
  if (argc == 1) {
LAB_00102ad8:
    run_benchmark("ellswift_keygen",bench_ellswift_create,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                  in_stack_ffffffffffffbf78);
  }
  else {
    lVar1 = lVar5 * 8;
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102a7e;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102ad8;
LAB_00102a7e:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102aab;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"keygen");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102ad8;
LAB_00102aab:
    lVar4 = 8;
    do {
      lVar3 = lVar4;
      if (lVar1 - lVar3 == 0) goto LAB_00102afc;
      iVar2 = strcmp(*(char **)((long)argv + lVar3),"ellswift_keygen");
      lVar4 = lVar3 + 8;
    } while (iVar2 != 0);
    if (lVar1 - lVar3 != 0) goto LAB_00102ad8;
  }
LAB_00102afc:
  if (argc != 1) {
    lVar5 = lVar5 * 8;
    lVar1 = 8;
    do {
      lVar4 = lVar1;
      if (lVar5 == lVar4) goto LAB_00102b36;
      iVar2 = strcmp(*(char **)((long)argv + lVar4),"ellswift");
      lVar1 = lVar4 + 8;
    } while (iVar2 != 0);
    if (lVar5 == lVar4) {
LAB_00102b36:
      lVar1 = 8;
      do {
        lVar4 = lVar1;
        if (lVar5 == lVar4) goto LAB_00102b63;
        iVar2 = strcmp(*(char **)((long)argv + lVar4),"ecdh");
        lVar1 = lVar4 + 8;
      } while (iVar2 != 0);
      if (lVar5 == lVar4) {
LAB_00102b63:
        lVar1 = 8;
        do {
          lVar4 = lVar1;
          if (lVar5 == lVar4) goto LAB_00102bb4;
          iVar2 = strcmp(*(char **)((long)argv + lVar4),"ellswift_ecdh");
          lVar1 = lVar4 + 8;
        } while (iVar2 != 0);
        if (lVar5 == lVar4) goto LAB_00102bb4;
      }
    }
  }
  run_benchmark("ellswift_ecdh",bench_ellswift_xdh,bench_ellswift_setup,
                (_func_void_void_ptr_int *)local_4078,(void *)(ulong)(uint)iters,in_R9D,
                in_stack_ffffffffffffbf78);
LAB_00102bb4:
  secp256k1_context_destroy(local_4078[0]);
  return;
}

Assistant:

void run_ellswift_bench(int iters, int argc, char **argv) {
    bench_ellswift_data data;
    int d = argc == 1;

    /* create a context with signing capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "encode") || have_flag(argc, argv, "ellswift_encode")) run_benchmark("ellswift_encode", bench_ellswift_encode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_decode")) run_benchmark("ellswift_decode", bench_ellswift_decode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ellswift_keygen")) run_benchmark("ellswift_keygen", bench_ellswift_create, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ecdh") || have_flag(argc, argv, "ellswift_ecdh")) run_benchmark("ellswift_ecdh", bench_ellswift_xdh, bench_ellswift_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}